

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr __thiscall c4::yml::Parser::_filter_dquot_scalar(Parser *this,substr s)

{
  substr r_00;
  substr r_01;
  csubstr fmt;
  csubstr fmt_00;
  csubstr fmt_01;
  csubstr fmt_02;
  csubstr fmt_03;
  csubstr fmt_04;
  bool bVar1;
  error_flags eVar2;
  Parser *in_RDX;
  char *in_RSI;
  long in_RDI;
  substr sVar3;
  ro_substr rVar4;
  csubstr cVar5;
  char msg_1 [31];
  char msg [42];
  size_t numbytes_1;
  uint32_t codepoint_val_1;
  csubstr codepoint_1;
  char readbuf_1 [8];
  size_t numbytes;
  uint32_t codepoint_val;
  csubstr codepoint;
  char readbuf [8];
  uint8_t byteval;
  size_t ii;
  char next;
  char curr;
  size_t i;
  bool filtered_chars;
  size_t pos;
  substr r;
  uint cv_2;
  char c_2;
  iterator __end2_2;
  iterator __begin2_2;
  csubstr *__range2_2;
  uint cv_1;
  char c_1;
  iterator __end2_1;
  iterator __begin2_1;
  csubstr *__range2_1;
  uchar cv;
  char c;
  iterator __end2;
  iterator __begin2;
  csubstr *__range2;
  size_t rnum_2;
  size_t rnum_1;
  size_t rnum;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  undefined4 in_stack_fffffffffffff9b8;
  uint32_t in_stack_fffffffffffff9bc;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  uint8_t *in_stack_fffffffffffff9c8;
  Location *in_stack_fffffffffffff9d0;
  Location *this_00;
  undefined8 in_stack_fffffffffffff9d8;
  code *pcVar6;
  basic_substring<char> *in_stack_fffffffffffff9e0;
  undefined1 *puVar7;
  bool local_5fb;
  bool local_5cb;
  size_t in_stack_fffffffffffffa58;
  undefined5 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa65;
  undefined1 in_stack_fffffffffffffa66;
  undefined1 in_stack_fffffffffffffa67;
  char local_56a;
  undefined7 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa7;
  char **i_00;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  size_t in_stack_fffffffffffffae0;
  size_t in_stack_fffffffffffffae8;
  size_t *in_stack_fffffffffffffaf0;
  size_t *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  undefined2 in_stack_fffffffffffffb04;
  undefined1 in_stack_fffffffffffffb06;
  undefined1 in_stack_fffffffffffffb07;
  char *in_stack_fffffffffffffb08;
  size_t in_stack_fffffffffffffb10;
  char *local_4e0;
  Parser *local_4d8;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined4 local_4c0;
  uint32_t uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  uint8_t *local_4b0;
  undefined1 local_4a8 [48];
  char *local_478;
  undefined4 local_470;
  size_t local_468;
  basic_substring<char_const> local_460 [16];
  char *local_450;
  size_t local_448;
  int local_43c [5];
  ro_substr local_428;
  undefined1 local_418 [8];
  basic_substring<char_const> local_410 [16];
  char *local_400;
  undefined4 local_3f8;
  size_t local_3f0;
  basic_substring<char_const> local_3e8 [16];
  char *local_3d8;
  size_t local_3d0;
  int local_3c4 [5];
  ro_substr local_3b0;
  undefined1 local_3a0 [8];
  basic_substring<char_const> local_398 [16];
  basic_substring<char_const> local_388 [32];
  ro_substr local_368;
  char local_351;
  basic_substring<char_const> local_350 [16];
  Parser *local_340;
  char local_331;
  char *local_330;
  Parser *local_328;
  char *local_320;
  Parser *local_318;
  char local_309;
  Parser *local_308;
  byte local_2f9;
  Parser *local_2f8;
  char *local_2f0;
  Parser *local_2e8;
  char *local_2d8;
  Parser *local_2d0;
  int local_2b8;
  char local_2b1;
  char *local_2b0;
  char *local_2a8;
  char **local_2a0;
  char *local_298;
  undefined4 local_290;
  int *local_288;
  char *local_280;
  size_t local_278;
  char local_269;
  char **local_268;
  char **local_260;
  int local_258;
  char local_251;
  char *local_250;
  char *local_248;
  char **local_240;
  char *local_238;
  undefined4 local_230;
  int *local_228;
  char *local_220;
  size_t local_218;
  char local_209;
  char **local_208;
  char **local_200;
  char **local_1f8;
  char **local_1f0;
  char local_1e2;
  char local_1e1;
  char *local_1e0;
  char *local_1d8;
  Parser *local_1d0;
  char *local_1c8;
  undefined4 local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  byte local_199;
  Parser *local_198;
  Parser *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  Parser *pPVar8;
  
  local_2d8 = in_RSI;
  local_2d0 = in_RDX;
  basic_substring<char>::count
            (in_stack_fffffffffffff9e0,(char)((ulong)in_stack_fffffffffffff9d8 >> 0x38),
             (size_t)in_stack_fffffffffffff9d0);
  _grow_filter_arena((Parser *)
                     CONCAT17(in_stack_fffffffffffffa67,
                              CONCAT16(in_stack_fffffffffffffa66,
                                       CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60)
                                      )),in_stack_fffffffffffffa58);
  local_2f0 = local_2d8;
  local_2e8 = local_2d0;
  local_2f8 = (Parser *)0x0;
  local_2f9 = 0;
  local_308 = (Parser *)0x0;
  do {
    pPVar8 = local_308;
    if (local_2e8 <= local_308) {
      if (*(Parser **)(in_RDI + 0xa80) < local_2f8) {
        memcpy(local_4a8,"check failed: (pos <= m_filter_arena.len)",0x2a);
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        pcVar6 = *(code **)(in_RDI + 0x9e8);
        puVar7 = local_4a8;
        Location::Location(in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                           CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                           CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
                           CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
        (*pcVar6)(puVar7,0x2a,*(undefined8 *)(in_RDI + 0x9d0));
        in_stack_fffffffffffff9b0 = uStack_4c8;
        in_stack_fffffffffffff9b4 = uStack_4c4;
        in_stack_fffffffffffff9b8 = local_4c0;
        in_stack_fffffffffffff9bc = uStack_4bc;
        in_stack_fffffffffffff9c0 = uStack_4b8;
        in_stack_fffffffffffff9c4 = uStack_4b4;
        in_stack_fffffffffffff9c8 = local_4b0;
      }
      if ((local_2f8 < local_2e8) || ((local_2f9 & 1) != 0)) {
        sVar3.str._4_4_ = in_stack_fffffffffffffadc;
        sVar3.str._0_4_ = in_stack_fffffffffffffad8;
        sVar3.len = in_stack_fffffffffffffae0;
        sVar3 = _finish_filter_arena
                          ((Parser *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                           sVar3,CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
        local_4e0 = sVar3.str;
        local_2f0 = local_4e0;
        local_4d8 = (Parser *)sVar3.len;
        local_2e8 = local_4d8;
      }
      if (local_2d0 < local_2e8) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        pcVar6 = *(code **)(in_RDI + 0x9e8);
        this_00 = (Location *)&stack0xfffffffffffffae8;
        Location::Location(this_00,(char *)in_stack_fffffffffffff9c8,
                           CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                           CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
                           CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
        (*pcVar6)(this_00,0x1f,*(undefined8 *)(in_RDI + 0x9d0));
      }
      rVar4 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x3c9fd3);
      cVar5.str = rVar4.str;
      cVar5.len = rVar4.len;
      return cVar5;
    }
    i_00 = &local_2f0;
    if (local_2e8 <= local_308) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) &&
         (in_stack_fffffffffffffaa7 = is_debugger_attached(), (bool)in_stack_fffffffffffffaa7)) {
        trap_instruction();
      }
      handle_error(0x3fa1ef,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
    }
    local_309 = (*i_00 + -0x38)[(long)(pPVar8->m_stack).m_buf];
    if ((local_309 == ' ') || (local_309 == '\t')) {
      local_320 = local_2f0;
      local_318 = local_2e8;
      r_00.len._0_4_ = in_stack_fffffffffffffac0;
      r_00.str = (char *)in_RDI;
      r_00.len._4_4_ = in_stack_fffffffffffffac4;
      _filter_ws<true>(in_RDX,r_00,(size_t *)i_00,
                       (size_t *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0));
    }
    else if (local_309 == '\n') {
      local_330 = local_2f0;
      local_328 = local_2e8;
      r_01.len = in_stack_fffffffffffffb10;
      r_01.str = in_stack_fffffffffffffb08;
      local_2f9 = _filter_nl<true,true>
                            ((Parser *)
                             CONCAT17(in_stack_fffffffffffffb07,
                                      CONCAT16(in_stack_fffffffffffffb06,
                                               CONCAT24(in_stack_fffffffffffffb04,
                                                        in_stack_fffffffffffffb00))),r_01,
                             in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
                             in_stack_fffffffffffffae8);
    }
    else if (local_309 != '\r') {
      if (local_309 == '\\') {
        if ((Parser *)((long)&(local_308->m_options).flags + 1U) < local_2e8) {
          pPVar8 = (Parser *)((long)&(local_308->m_options).flags + 1);
          if (local_2e8 <= pPVar8) {
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            handle_error(0x3fa1ef,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
          }
          local_56a = local_2f0[(long)pPVar8];
        }
        else {
          local_56a = '\0';
        }
        local_331 = local_56a;
        local_2f9 = 1;
        if ((local_56a == '\r') &&
           ((Parser *)((long)&(local_308->m_options).flags + 2U) < local_2e8)) {
          pPVar8 = (Parser *)((long)&(local_308->m_options).flags + 2);
          if (local_2e8 <= pPVar8) {
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            in_stack_fffffffffffffe80 =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            handle_error(0x3fa1ef,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
          }
          if (local_2f0[(long)pPVar8] == '\n') {
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_331 = '\n';
          }
        }
        if (local_331 == '\n') {
          for (local_340 = (Parser *)((long)&(local_308->m_options).flags + 2);
              (local_340 < local_2e8 &&
              ((local_2f0[(long)local_340] == ' ' || (local_2f0[(long)local_340] == '\t'))));
              local_340 = (Parser *)((long)&(local_340->m_options).flags + 1)) {
          }
          local_308 = (Parser *)((long)&local_340[-1].m_newline_offsets_buf.len + 7);
        }
        else if ((((local_331 == '\"') || (local_331 == '/')) || (local_331 == ' ')) ||
                (local_331 == '\t')) {
          *(char *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
               local_331;
          local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
          local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 1);
        }
        else if (local_331 != '\r') {
          if (local_331 == 'n') {
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 10;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 1);
          }
          else if (local_331 == 'r') {
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 0xd;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 1);
          }
          else if (local_331 == 't') {
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 9;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 1);
          }
          else if (local_331 == '\\') {
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 0x5c;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 1);
          }
          else if (local_331 == 'x') {
            if (local_2e8 <= (Parser *)((long)&(local_308->m_options).flags + 3U)) {
              bVar1 = is_debugger_attached();
              if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              basic_substring<char_const>::basic_substring<32ul>
                        (local_350,(char (*) [32])"ERROR: \\x requires 2 hex digits");
              fmt.len = (size_t)in_stack_fffffffffffffe80;
              fmt.str = in_stack_fffffffffffffe78;
              _err<>(in_stack_fffffffffffffe70,fmt);
            }
            pPVar8 = local_308;
            local_351 = '\0';
            if (local_2e8 < (Parser *)((long)&(local_308->m_options).flags + 2U)) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              handle_error(0x3fa1ef,(char *)0x153a,"check failed: %s","first >= 0 && first <= len");
            }
            if (local_2e8 < (Parser *)0x2) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              handle_error(0x3fa1ef,(char *)0x153b,"check failed: %s",
                           "(num >= 0 && num <= len) || (num == npos)");
            }
            if (local_2e8 < &pPVar8->field_0x4) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              handle_error(0x3fa1ef,(char *)0x153d,"check failed: %s",
                           "(first >= 0 && first + rnum <= len) || (num == 0)");
            }
            basic_substring<char>::basic_substring
                      ((basic_substring<char> *)in_stack_fffffffffffff9d0,
                       (char *)in_stack_fffffffffffff9c8,
                       CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
            local_368 = basic_substring::operator_cast_to_basic_substring
                                  ((basic_substring<char> *)0x3c8767);
            local_1b0 = local_368.str;
            local_1a8 = (char *)local_368.len;
            local_1b8 = &local_351;
            in_stack_fffffffffffffe78 = (char *)&stack0xfffffffffffffe50;
            if ((char *)local_368.len == (char *)0x0 || local_368.str == (char *)0x0) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              local_1c8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_1c0 = 0x2cac;
              handle_error(0x3fa1ef,(char *)0x2cac,"check failed: %s","!s.empty()");
            }
            *local_1b8 = '\0';
            local_1d0 = (Parser *)&stack0xfffffffffffffe50;
            local_1e0 = local_1b0 + (long)local_1a8;
            local_198 = local_1d0;
            in_stack_fffffffffffffe70 = local_1d0;
            for (local_1d8 = local_1b0; local_1d8 != local_1e0; local_1d8 = local_1d8 + 1) {
              local_1e1 = *local_1d8;
              if ((local_1e1 < '0') || ('9' < local_1e1)) {
                if ((local_1e1 < 'a') || ('f' < local_1e1)) {
                  if ((local_1e1 < 'A') || ('F' < local_1e1)) {
                    local_199 = 0;
                    goto LAB_003c89e2;
                  }
                  local_1e2 = local_1e1 + -0x37;
                }
                else {
                  local_1e2 = local_1e1 + -0x57;
                }
              }
              else {
                local_1e2 = local_1e1 + -0x30;
              }
              *local_1b8 = *local_1b8 * '\x10' + local_1e2;
            }
            local_199 = 1;
LAB_003c89e2:
            if (((local_199 ^ 0xff) & 1) != 0) {
              bVar1 = is_debugger_attached();
              if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              basic_substring<char_const>::basic_substring<35ul>
                        (local_388,(char (*) [35])"ERROR: failed to read \\x codepoint");
              fmt_00.len = (size_t)in_stack_fffffffffffffe80;
              fmt_00.str = in_stack_fffffffffffffe78;
              _err<>(in_stack_fffffffffffffe70,fmt_00);
            }
            *(char *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 local_351;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 3);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 1);
          }
          else if (local_331 == 'u') {
            if (local_2e8 <= &local_308->field_0x5) {
              bVar1 = is_debugger_attached();
              if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              basic_substring<char_const>::basic_substring<32ul>
                        (local_398,(char (*) [32])"ERROR: \\u requires 4 hex digits");
              fmt_01.len = (size_t)in_stack_fffffffffffffe80;
              fmt_01.str = in_stack_fffffffffffffe78;
              _err<>(in_stack_fffffffffffffe70,fmt_01);
            }
            pPVar8 = local_308;
            if (local_2e8 < (Parser *)((long)&(local_308->m_options).flags + 2U)) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              handle_error(0x3fa1ef,(char *)0x153a,"check failed: %s","first >= 0 && first <= len");
            }
            if (local_2e8 < (Parser *)0x4) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              handle_error(0x3fa1ef,(char *)0x153b,"check failed: %s",
                           "(num >= 0 && num <= len) || (num == npos)");
            }
            if (local_2e8 < &pPVar8->field_0x6) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              handle_error(0x3fa1ef,(char *)0x153d,"check failed: %s",
                           "(first >= 0 && first + rnum <= len) || (num == 0)");
            }
            basic_substring<char>::basic_substring
                      ((basic_substring<char> *)in_stack_fffffffffffff9d0,
                       (char *)in_stack_fffffffffffff9c8,
                       CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
            local_3b0 = basic_substring::operator_cast_to_basic_substring
                                  ((basic_substring<char> *)0x3c8de8);
            local_3c4[0] = 0;
            local_3d8 = local_3b0.str;
            local_3d0 = local_3b0.len;
            local_220 = local_3b0.str;
            local_218 = local_3b0.len;
            local_228 = local_3c4;
            local_1f8 = &local_220;
            local_5cb = local_3b0.len == 0 || local_3b0.str == (char *)0x0;
            if (local_5cb) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              local_238 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_230 = 0x2cac;
              handle_error(0x3fa1ef,(char *)0x2cac,"check failed: %s","!s.empty()");
            }
            *local_228 = 0;
            local_240 = &local_220;
            local_250 = local_220 + local_218;
            local_208 = local_240;
            local_200 = local_240;
            for (local_248 = local_220; local_248 != local_250; local_248 = local_248 + 1) {
              local_251 = *local_248;
              if ((local_251 < '0') || ('9' < local_251)) {
                if ((local_251 < 'a') || ('f' < local_251)) {
                  if ((local_251 < 'A') || ('F' < local_251)) {
                    local_209 = '\0';
                    goto LAB_003c9085;
                  }
                  local_258 = local_251 + -0x37;
                }
                else {
                  local_258 = local_251 + -0x57;
                }
              }
              else {
                local_258 = local_251 + -0x30;
              }
              *local_228 = *local_228 * 0x10 + local_258;
            }
            local_209 = '\x01';
LAB_003c9085:
            if (local_209 == '\0') {
              bVar1 = is_debugger_attached();
              if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              basic_substring<char_const>::basic_substring<36ul>
                        (local_3e8,(char (*) [36])"ERROR: failed to parse \\u codepoint");
              fmt_02.len = (size_t)in_stack_fffffffffffffe80;
              fmt_02.str = in_stack_fffffffffffffe78;
              _err<>(in_stack_fffffffffffffe70,fmt_02);
            }
            local_3f0 = decode_code_point(in_stack_fffffffffffff9c8,
                                          CONCAT44(in_stack_fffffffffffff9c4,
                                                   in_stack_fffffffffffff9c0),
                                          in_stack_fffffffffffff9bc);
            if (4 < local_3f0) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              local_400 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_3f8 = 0x7cfa;
              handle_error(0x3fa1ef,(char *)0x7cfa,"check failed: %s","numbytes <= 4");
            }
            memcpy((void *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38),
                   local_3a0,local_3f0);
            local_308 = (Parser *)&local_308->field_0x5;
            local_2f8 = (Parser *)((long)(local_2f8->m_stack).m_buf + (local_3f0 - 0x38));
          }
          else if (local_331 == 'U') {
            if (local_2e8 <= (Parser *)((long)&(local_308->m_file).str + 1U)) {
              bVar1 = is_debugger_attached();
              if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              basic_substring<char_const>::basic_substring<32ul>
                        (local_410,(char (*) [32])"ERROR: \\U requires 8 hex digits");
              fmt_03.len = (size_t)in_stack_fffffffffffffe80;
              fmt_03.str = in_stack_fffffffffffffe78;
              _err<>(in_stack_fffffffffffffe70,fmt_03);
            }
            pPVar8 = local_308;
            if (local_2e8 < (Parser *)((long)&(local_308->m_options).flags + 2U)) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              handle_error(0x3fa1ef,(char *)0x153a,"check failed: %s","first >= 0 && first <= len");
            }
            if (local_2e8 < (Parser *)0x8) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              handle_error(0x3fa1ef,(char *)0x153b,"check failed: %s",
                           "(num >= 0 && num <= len) || (num == npos)");
            }
            if (local_2e8 < (Parser *)((long)&(pPVar8->m_file).str + 2U)) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              handle_error(0x3fa1ef,(char *)0x153d,"check failed: %s",
                           "(first >= 0 && first + rnum <= len) || (num == 0)");
            }
            basic_substring<char>::basic_substring
                      ((basic_substring<char> *)in_stack_fffffffffffff9d0,
                       (char *)in_stack_fffffffffffff9c8,
                       CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
            local_428 = basic_substring::operator_cast_to_basic_substring
                                  ((basic_substring<char> *)0x3c94f6);
            local_43c[0] = 0;
            local_450 = local_428.str;
            local_448 = local_428.len;
            local_280 = local_428.str;
            local_278 = local_428.len;
            local_288 = local_43c;
            local_1f0 = &local_280;
            local_5fb = local_428.len == 0 || local_428.str == (char *)0x0;
            if (local_5fb) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              local_298 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_290 = 0x2cac;
              handle_error(0x3fa1ef,(char *)0x2cac,"check failed: %s","!s.empty()");
            }
            *local_288 = 0;
            local_2a0 = &local_280;
            local_2b0 = local_280 + local_278;
            local_268 = local_2a0;
            local_260 = local_2a0;
            for (local_2a8 = local_280; local_2a8 != local_2b0; local_2a8 = local_2a8 + 1) {
              local_2b1 = *local_2a8;
              if ((local_2b1 < '0') || ('9' < local_2b1)) {
                if ((local_2b1 < 'a') || ('f' < local_2b1)) {
                  if ((local_2b1 < 'A') || ('F' < local_2b1)) {
                    local_269 = '\0';
                    goto LAB_003c9784;
                  }
                  local_2b8 = local_2b1 + -0x37;
                }
                else {
                  local_2b8 = local_2b1 + -0x57;
                }
              }
              else {
                local_2b8 = local_2b1 + -0x30;
              }
              *local_288 = *local_288 * 0x10 + local_2b8;
            }
            local_269 = '\x01';
LAB_003c9784:
            if (local_269 == '\0') {
              bVar1 = is_debugger_attached();
              if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              basic_substring<char_const>::basic_substring<36ul>
                        (local_460,(char (*) [36])"ERROR: failed to parse \\U codepoint");
              fmt_04.len = (size_t)in_stack_fffffffffffffe80;
              fmt_04.str = in_stack_fffffffffffffe78;
              _err<>(in_stack_fffffffffffffe70,fmt_04);
            }
            local_468 = decode_code_point(in_stack_fffffffffffff9c8,
                                          CONCAT44(in_stack_fffffffffffff9c4,
                                                   in_stack_fffffffffffff9c0),
                                          in_stack_fffffffffffff9bc);
            if (4 < local_468) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              local_478 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_470 = 0x7d09;
              handle_error(0x3fa1ef,(char *)0x7d09,"check failed: %s","numbytes <= 4");
            }
            memcpy((void *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38),
                   local_418,local_468);
            local_308 = (Parser *)((long)&(local_308->m_file).str + 1);
            local_2f8 = (Parser *)((long)(local_2f8->m_stack).m_buf + (local_468 - 0x38));
          }
          else if (local_331 == '0') {
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 0;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 1);
          }
          else if (local_331 == 'b') {
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 8;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 1);
          }
          else if (local_331 == 'f') {
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 0xc;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 1);
          }
          else if (local_331 == 'a') {
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 7;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 1);
          }
          else if (local_331 == 'v') {
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 0xb;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 1);
          }
          else if (local_331 == 'e') {
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 0x1b;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 1);
          }
          else if (local_331 == '_') {
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 0xc2;
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x37) =
                 0xa0;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 2);
          }
          else if (local_331 == 'N') {
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 0xc2;
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x37) =
                 0x85;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 2);
          }
          else if (local_331 == 'L') {
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 0xe2;
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x37) =
                 0x80;
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x36) =
                 0xa8;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 3);
          }
          else if (local_331 == 'P') {
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) =
                 0xe2;
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x37) =
                 0x80;
            *(undefined1 *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x36) =
                 0xa9;
            local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
            local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 3);
          }
        }
      }
      else {
        *(char *)((long)(local_2f8->m_stack).m_buf + *(long *)(in_RDI + 0xa78) + -0x38) = local_309;
        local_2f8 = (Parser *)((long)&(local_2f8->m_options).flags + 1);
      }
    }
    local_308 = (Parser *)((long)&(local_308->m_options).flags + 1);
  } while( true );
}

Assistant:

csubstr Parser::_filter_dquot_scalar(substr s)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfdq(...) _c4dbgpf("filt_dquo_scalar" __VA_ARGS__)
    #else
    #define _c4dbgfdq(...)
    #endif

    _c4dbgfdq(": before=~~~{}~~~", s);

    // from the YAML spec for double-quoted scalars:
    // https://yaml.org/spec/1.2-old/spec.html#style/flow/double-quoted
    //
    // All leading and trailing white space characters are excluded
    // from the content. Each continuation line must therefore contain
    // at least one non-space character. Empty lines, if any, are
    // consumed as part of the line folding.

    _grow_filter_arena(s.len + 2u * s.count('\\'));
    substr r = s;
    size_t pos = 0; // the filtered size
    bool filtered_chars = false;
    for(size_t i = 0; i < r.len; ++i)
    {
        const char curr = r[i];
        _c4dbgfdq("[{}]: '{}'", i, _c4prc(curr));
        if(curr == ' ' || curr == '\t')
        {
            _filter_ws</*keep_trailing_ws*/true>(r, &i, &pos);
        }
        else if(curr == '\n')
        {
            filtered_chars = _filter_nl</*backslash_is_escape*/true, /*keep_trailing_ws*/true>(r, &i, &pos, /*indentation*/0);
        }
        else if(curr == '\r')  // skip \r --- https://stackoverflow.com/questions/1885900
        {
            ;
        }
        else if(curr == '\\')
        {
            char next = i+1 < r.len ? r[i+1] : '\0';
            _c4dbgfdq("[{}]: backslash, next='{}'", i, _c4prc(next));
            filtered_chars = true;
            if(next == '\r')
            {
                if(i+2 < r.len && r[i+2] == '\n')
                {
                    ++i; // newline escaped with \ -- skip both (add only one as i is loop-incremented)
                    next = '\n';
                    _c4dbgfdq("[{}]: was \\r\\n, now next='\\n'", i);
                }
            }
            // remember the loop will also increment i
            if(next == '\n')
            {
                size_t ii = i + 2;
                for( ; ii < r.len; ++ii)
                {
                    if(r.str[ii] == ' ' || r.str[ii] == '\t')  // skip leading whitespace
                        ;
                    else
                        break;
                }
                i += ii - i - 1;
            }
            else if(next == '"' || next == '/'  || next == ' ' || next == '\t') // escapes for json compatibility
            {
                m_filter_arena.str[pos++] = next;
                ++i;
            }
            else if(next == '\r')
            {
                //++i;
            }
            else if(next == 'n')
            {
                m_filter_arena.str[pos++] = '\n';
                ++i;
            }
            else if(next == 'r')
            {
                m_filter_arena.str[pos++] = '\r';
                ++i; // skip
            }
            else if(next == 't')
            {
                m_filter_arena.str[pos++] = '\t';
                ++i;
            }
            else if(next == '\\')
            {
                m_filter_arena.str[pos++] = '\\';
                ++i;
            }
            else if(next == 'x') // UTF8
            {
                if(i + 1u + 2u >= r.len)
                    _c4err("\\x requires 2 hex digits");
                uint8_t byteval = {};
                if(!read_hex(r.sub(i + 2u, 2u), &byteval))
                    _c4err("failed to read \\x codepoint");
                m_filter_arena.str[pos++] = *(char*)&byteval;
                i += 1u + 2u;
            }
            else if(next == 'u') // UTF16
            {
                if(i + 1u + 4u >= r.len)
                    _c4err("\\u requires 4 hex digits");
                char readbuf[8];
                csubstr codepoint = r.sub(i + 2u, 4u);
                uint32_t codepoint_val = {};
                if(!read_hex(codepoint, &codepoint_val))
                    _c4err("failed to parse \\u codepoint");
                size_t numbytes = decode_code_point((uint8_t*)readbuf, sizeof(readbuf), codepoint_val);
                C4_ASSERT(numbytes <= 4);
                memcpy(m_filter_arena.str + pos, readbuf, numbytes);
                pos += numbytes;
                i += 1u + 4u;
            }
            else if(next == 'U') // UTF32
            {
                if(i + 1u + 8u >= r.len)
                    _c4err("\\U requires 8 hex digits");
                char readbuf[8];
                csubstr codepoint = r.sub(i + 2u, 8u);
                uint32_t codepoint_val = {};
                if(!read_hex(codepoint, &codepoint_val))
                    _c4err("failed to parse \\U codepoint");
                size_t numbytes = decode_code_point((uint8_t*)readbuf, sizeof(readbuf), codepoint_val);
                C4_ASSERT(numbytes <= 4);
                memcpy(m_filter_arena.str + pos, readbuf, numbytes);
                pos += numbytes;
                i += 1u + 8u;
            }
            // https://yaml.org/spec/1.2.2/#rule-c-ns-esc-char
            else if(next == '0')
            {
                m_filter_arena.str[pos++] = '\0';
                ++i;
            }
            else if(next == 'b') // backspace
            {
                m_filter_arena.str[pos++] = '\b';
                ++i;
            }
            else if(next == 'f') // form feed
            {
                m_filter_arena.str[pos++] = '\f';
                ++i;
            }
            else if(next == 'a') // bell character
            {
                m_filter_arena.str[pos++] = '\a';
                ++i;
            }
            else if(next == 'v') // vertical tab
            {
                m_filter_arena.str[pos++] = '\v';
                ++i;
            }
            else if(next == 'e') // escape character
            {
                m_filter_arena.str[pos++] = '\x1b';
                ++i;
            }
            else if(next == '_') // unicode non breaking space \u00a0
            {
                // https://www.compart.com/en/unicode/U+00a0
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x3e, 0xc2);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x60, 0xa0);
                ++i;
            }
            else if(next == 'N') // unicode next line \u0085
            {
                // https://www.compart.com/en/unicode/U+0085
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x3e, 0xc2);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x7b, 0x85);
                ++i;
            }
            else if(next == 'L') // unicode line separator \u2028
            {
                // https://www.utf8-chartable.de/unicode-utf8-table.pl?start=8192&number=1024&names=-&utf8=0x&unicodeinhtml=hex
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x1e, 0xe2);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x80, 0x80);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x58, 0xa8);
                ++i;
            }
            else if(next == 'P') // unicode paragraph separator \u2029
            {
                // https://www.utf8-chartable.de/unicode-utf8-table.pl?start=8192&number=1024&names=-&utf8=0x&unicodeinhtml=hex
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x1e, 0xe2);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x80, 0x80);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x57, 0xa9);
                ++i;
            }
            _c4dbgfdq("[{}]: backslash...sofar=[{}]~~~{}~~~", i, pos, m_filter_arena.first(pos));
        }
        else
        {
            m_filter_arena.str[pos++] = curr;
        }
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
    if(pos < r.len || filtered_chars)
    {
        r = _finish_filter_arena(r, pos);
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, s.len >= r.len);
    _c4dbgpf(": #filteredchars={} after=~~~{}~~~", s.len - r.len, r);

    #undef _c4dbgfdq

    return r;
}